

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_vector.h
# Opt level: O2

bool __thiscall
crnlib::vector<crnlib::color_quad<unsigned_char,_int>_>::grant_ownership
          (vector<crnlib::color_quad<unsigned_char,_int>_> *this,color_quad<unsigned_char,_int> *p,
          uint size,uint capacity)

{
  if (capacity < size) {
    return false;
  }
  if (p + capacity <= this->m_p || this->m_p + this->m_capacity <= p) {
    if (p == (color_quad<unsigned_char,_int> *)0x0) {
      if (capacity != 0) {
        return false;
      }
    }
    else if (capacity == 0) {
      return false;
    }
    clear(this);
    this->m_p = p;
    this->m_size = size;
    this->m_capacity = capacity;
    return true;
  }
  return false;
}

Assistant:

inline bool grant_ownership(T* p, uint size, uint capacity) {
    // To to prevent the caller from obviously shooting themselves in the foot.
    if (((p + capacity) > m_p) && (p < (m_p + m_capacity))) {
      // Can grant ownership of a block inside the container itself!
      CRNLIB_ASSERT(0);
      return false;
    }

    if (size > capacity) {
      CRNLIB_ASSERT(0);
      return false;
    }

    if (!p) {
      if (capacity) {
        CRNLIB_ASSERT(0);
        return false;
      }
    } else if (!capacity) {
      CRNLIB_ASSERT(0);
      return false;
    }

    clear();
    m_p = p;
    m_size = size;
    m_capacity = capacity;
    return true;
  }